

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O2

SRC_ERROR sinc_multichan_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  float fVar1;
  float fVar2;
  int iVar3;
  uint divisor;
  SINC_FILTER *filter;
  float *pfVar4;
  bool bVar5;
  long lVar6;
  int ch_2;
  SRC_ERROR SVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int ch;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  int half_filter_chan_len;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int divisor_00;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  filter = (SINC_FILTER *)state->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    SVar7 = SRC_ERR_NO_PRIVATE;
  }
  else {
    iVar12 = state->channels;
    lVar15 = (long)iVar12;
    filter->in_count = data->input_frames * lVar15;
    lVar16 = data->output_frames * lVar15;
    filter->out_count = lVar16;
    filter->out_gen = 0;
    filter->in_used = 0;
    dVar22 = state->last_ratio;
    SVar7 = SRC_ERR_BAD_INTERNAL_STATE;
    if ((0.00390625 <= dVar22) && (dVar22 <= 256.0)) {
      dVar24 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
      dVar21 = dVar22;
      if (data->src_ratio <= dVar22) {
        dVar21 = data->src_ratio;
      }
      dVar23 = state->last_position;
      half_filter_chan_len =
           ((int)ROUND((double)(-(ulong)(dVar21 < 1.0) & (ulong)(dVar24 / dVar21) |
                               ~-(ulong)(dVar21 < 1.0) & (ulong)dVar24)) + 1) * iVar12;
      dVar21 = dVar23 - (double)(int)ROUND(dVar23);
      dVar21 = (double)(~-(ulong)(dVar21 < 0.0) & (ulong)dVar21 |
                       (ulong)(dVar21 + 1.0) & -(ulong)(dVar21 < 0.0));
      iVar8 = filter->b_len;
      lVar6 = (long)((int)ROUND(dVar23 - dVar21) * iVar12 + filter->b_current) % (long)iVar8;
      dVar24 = 1.0 / dVar22;
      filter->b_current = (int)lVar6;
      lVar17 = 0;
      while (iVar12 = (int)lVar6, lVar17 < lVar16) {
        if (((filter->b_end - iVar12) + iVar8) % iVar8 <= half_filter_chan_len) {
          SVar7 = prepare_data(filter,(int)lVar15,data,half_filter_chan_len);
          state->error = SVar7;
          if (SVar7 != SRC_ERR_NO_ERROR) {
            return SVar7;
          }
          iVar12 = filter->b_current;
          if (((filter->b_end - iVar12) + filter->b_len) % filter->b_len <= half_filter_chan_len)
          break;
        }
        if ((-1 < filter->b_real_end) &&
           ((double)filter->b_real_end <= (double)iVar12 + dVar21 + dVar24 + 1e-20)) break;
        if (filter->out_count < 1) {
          lVar16 = filter->out_gen;
        }
        else {
          dVar23 = state->last_ratio;
          lVar16 = filter->out_gen;
          if (1e-10 < ABS(dVar23 - data->src_ratio)) {
            dVar22 = ((data->src_ratio - dVar23) * (double)lVar16) / (double)filter->out_count +
                     dVar23;
          }
        }
        iVar3 = filter->index_inc;
        dVar23 = dVar22;
        if (1.0 <= dVar22) {
          dVar23 = 1.0;
        }
        dVar23 = dVar23 * (double)iVar3;
        divisor_00 = (int)ROUND(dVar23 * 4096.0);
        iVar14 = (int)ROUND(dVar21 * dVar23 * 4096.0);
        divisor = state->channels;
        pfVar4 = data->data_out;
        iVar18 = filter->coeff_half_len * 0x1000;
        iVar8 = (iVar18 - iVar14) / divisor_00;
        uVar20 = iVar8 * divisor_00 + iVar14;
        uVar13 = iVar12 - divisor * iVar8;
        if ((int)uVar13 < 0) {
          uVar9 = int_div_ceil(-uVar13,divisor);
          uVar10 = int_div_ceil(uVar20,divisor_00);
          if (uVar10 < uVar9) {
            __assert_fail("steps <= int_div_ceil (filter_index, increment)",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x3f4,
                          "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                         );
          }
          uVar20 = uVar20 - uVar9 * divisor_00;
          uVar13 = divisor * uVar9 + uVar13;
        }
        memset(filter->left_calc,0,(long)(int)divisor * 8);
        uVar19 = 0;
        if (0 < (int)divisor) {
          uVar19 = (ulong)divisor;
        }
        for (; -1 < (int)uVar20; uVar20 = uVar20 - divisor_00) {
          uVar9 = uVar20 >> 0xc;
          if (filter->coeff_half_len < (int)uVar9) {
            __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x3fe,
                          "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                         );
          }
          if (((int)uVar13 < 0) || (uVar10 = uVar13 + divisor, filter->b_len < (int)uVar10)) {
            __assert_fail("data_index >= 0 && data_index + channels - 1 < filter->b_len",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x401,
                          "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                         );
          }
          if (filter->b_end < (int)uVar10) {
            __assert_fail("data_index + channels - 1 < filter->b_end",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x402,
                          "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                         );
          }
          fVar1 = filter->coeffs[uVar9];
          fVar2 = filter->coeffs[(ulong)uVar9 + 1];
          for (uVar11 = 0; uVar19 != uVar11; uVar11 = uVar11 + 1) {
            filter->left_calc[uVar11] =
                 (double)filter->buffer[uVar13 + uVar11] *
                 ((double)(uVar20 & 0xfff) * 0.000244140625 * (double)(fVar2 - fVar1) +
                 (double)fVar1) + filter->left_calc[uVar11];
          }
          uVar13 = uVar10;
        }
        iVar8 = (iVar18 - (divisor_00 - iVar14)) / divisor_00;
        iVar12 = filter->b_current;
        uVar20 = (iVar8 + 1) * divisor + iVar12;
        memset(filter->right_calc,0,(long)(int)divisor * 8);
        uVar13 = iVar8 * divisor_00 + (divisor_00 - iVar14);
        do {
          uVar9 = (int)uVar13 >> 0xc;
          if (((int)uVar9 < 0) || (filter->coeff_half_len < (int)uVar9)) {
            __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x414,
                          "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                         );
          }
          if ((int)uVar20 < 0) {
LAB_00105fc0:
            __assert_fail("data_index >= 0 && data_index + channels - 1 < filter->b_len",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x416,
                          "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                         );
          }
          iVar8 = filter->b_len;
          if (iVar8 < (int)(uVar20 + divisor)) goto LAB_00105fc0;
          if (filter->b_end < (int)(uVar20 + divisor)) {
            __assert_fail("data_index + channels - 1 < filter->b_end",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x417,
                          "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                         );
          }
          fVar1 = filter->coeffs[uVar9];
          fVar2 = filter->coeffs[(ulong)uVar9 + 1];
          for (uVar11 = 0; uVar19 != uVar11; uVar11 = uVar11 + 1) {
            filter->right_calc[uVar11] =
                 (double)filter->buffer[uVar20 + uVar11] *
                 ((double)(uVar13 & 0xfff) * 0.000244140625 * (double)(fVar2 - fVar1) +
                 (double)fVar1) + filter->right_calc[uVar11];
          }
          uVar20 = uVar20 - divisor;
          uVar9 = uVar13 - divisor_00;
          bVar5 = divisor_00 <= (int)uVar13;
          uVar13 = uVar9;
        } while (uVar9 != 0 && bVar5);
        for (uVar11 = 0; uVar19 != uVar11; uVar11 = uVar11 + 1) {
          pfVar4[lVar16 + uVar11] =
               (float)((filter->left_calc[uVar11] + filter->right_calc[uVar11]) *
                      (dVar23 / (double)iVar3));
        }
        iVar3 = state->channels;
        lVar15 = (long)iVar3;
        lVar17 = lVar15 + filter->out_gen;
        dVar23 = dVar21 + 1.0 / dVar22;
        filter->out_gen = lVar17;
        dVar21 = dVar23 - (double)(int)ROUND(dVar23);
        dVar21 = (double)(~-(ulong)(dVar21 < 0.0) & (ulong)dVar21 |
                         (ulong)(dVar21 + 1.0) & -(ulong)(dVar21 < 0.0));
        lVar6 = (long)((int)ROUND(dVar23 - dVar21) * iVar3 + iVar12) % (long)iVar8;
        filter->b_current = (int)lVar6;
        lVar16 = filter->out_count;
      }
      state->last_position = dVar21;
      state->last_ratio = dVar22;
      iVar12 = state->channels;
      data->input_frames_used = filter->in_used / (long)iVar12;
      data->output_frames_gen = filter->out_gen / (long)iVar12;
      SVar7 = SRC_ERR_NO_ERROR;
    }
  }
  return SVar7;
}

Assistant:

static SRC_ERROR
sinc_multichan_vari_process (SRC_STATE *state, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) state->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * state->channels ;
	filter->out_count = data->output_frames * state->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (state->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (state->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = state->channels * (int) (psf_lrint (count) + 1) ;

	input_index = state->last_position ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((state->error = prepare_data (filter, state->channels, data, half_filter_chan_len)) != 0)
				return state->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = state->last_ratio + filter->out_gen * (data->src_ratio - state->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_multi (filter, increment, start_filter_index, state->channels, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += state->channels ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	state->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / state->channels ;
	data->output_frames_gen = filter->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}